

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall vkt::shaderexecutor::Functions::ATan2::~ATan2(ATan2 *this)

{
  ATan2 *this_local;
  
  ~ATan2(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

ATan2			(void) : CFloatFunc2 ("atan", deAtan2) {}